

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3Transform(Vector3 v,Matrix mat)

{
  float x;
  float fVar1;
  float fVar2;
  float fVar3;
  Vector3 VVar4;
  
  fVar3 = v.z;
  fVar1 = v.x;
  fVar2 = v.y;
  VVar4.z = fVar3 * mat.m10 + mat.m2 * fVar1 + fVar2 * mat.m6 + mat.m14;
  VVar4.y = mat.m9 * fVar3 + mat.m1 * fVar1 + mat.m5 * fVar2 + mat.m13;
  VVar4.x = mat.m8 * fVar3 + mat.m0 * fVar1 + mat.m4 * fVar2 + mat.m12;
  return VVar4;
}

Assistant:

RMDEF Vector3 Vector3Transform(Vector3 v, Matrix mat)
{
    Vector3 result = { 0 };
    float x = v.x;
    float y = v.y;
    float z = v.z;

    result.x = mat.m0*x + mat.m4*y + mat.m8*z + mat.m12;
    result.y = mat.m1*x + mat.m5*y + mat.m9*z + mat.m13;
    result.z = mat.m2*x + mat.m6*y + mat.m10*z + mat.m14;

    return result;
}